

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfdriver.c
# Opt level: O0

char * sfnt_get_ps_name(TT_Face face)

{
  byte bVar1;
  char *pcVar2;
  TT_Face local_30;
  char *result;
  int local_20;
  FT_Int apple;
  FT_Int win;
  FT_Int found;
  TT_Face face_local;
  
  if (face->postscript_name == (char *)0x0) {
    _win = face;
    if ((face->blend == (GX_Blend)0x0) ||
       ((((face->root).face_index & 0x7fff0000U) == 0 && (((face->root).face_flags & 0x8000U) == 0))
       )) {
      bVar1 = sfnt_get_name_id(face,6,&local_20,(FT_Int *)((long)&result + 4));
      apple = (FT_Int)bVar1;
      if (apple == 0) {
        face_local = (TT_Face)0x0;
      }
      else {
        if (local_20 == -1) {
          local_30 = (TT_Face)get_apple_string((_win->root).memory,(_win->name_table).stream,
                                               (_win->name_table).names + result._4_4_,
                                               sfnt_is_postscript,'\x01');
        }
        else {
          local_30 = (TT_Face)get_win_string((_win->root).memory,(_win->name_table).stream,
                                             (_win->name_table).names + local_20,sfnt_is_postscript,
                                             '\x01');
        }
        _win->postscript_name = (char *)local_30;
        face_local = local_30;
      }
    }
    else {
      pcVar2 = sfnt_get_var_ps_name(face);
      _win->postscript_name = pcVar2;
      face_local = (TT_Face)_win->postscript_name;
    }
  }
  else {
    face_local = (TT_Face)face->postscript_name;
  }
  return (char *)face_local;
}

Assistant:

static const char*
  sfnt_get_ps_name( TT_Face  face )
  {
    FT_Int       found, win, apple;
    const char*  result = NULL;


    if ( face->postscript_name )
      return face->postscript_name;

#ifdef TT_CONFIG_OPTION_GX_VAR_SUPPORT
    if ( face->blend                                 &&
         ( FT_IS_NAMED_INSTANCE( FT_FACE( face ) ) ||
           FT_IS_VARIATION( FT_FACE( face ) )      ) )
    {
      face->postscript_name = sfnt_get_var_ps_name( face );
      return face->postscript_name;
    }
#endif

    /* scan the name table to see whether we have a Postscript name here, */
    /* either in Macintosh or Windows platform encodings                  */
    found = sfnt_get_name_id( face, TT_NAME_ID_PS_NAME, &win, &apple );
    if ( !found )
      return NULL;

    /* prefer Windows entries over Apple */
    if ( win != -1 )
      result = get_win_string( face->root.memory,
                               face->name_table.stream,
                               face->name_table.names + win,
                               sfnt_is_postscript,
                               1 );
    else
      result = get_apple_string( face->root.memory,
                                 face->name_table.stream,
                                 face->name_table.names + apple,
                                 sfnt_is_postscript,
                                 1 );

    face->postscript_name = result;

    return result;
  }